

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O2

Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
__thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::RRLoadBlancer::
operator()(RRLoadBlancer *this,
          load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> *load_blancer)

{
  _Head_base<0UL,_std::atomic<unsigned_int>_*,_false> _Var1;
  undefined8 in_RDX;
  
  _Var1._M_head_impl = (atomic<unsigned_int> *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (_Var1._M_head_impl == (atomic<unsigned_int> *)0x0) {
    (this->index)._M_t.
    super___uniq_ptr_impl<std::atomic<unsigned_int>,_std::default_delete<std::atomic<unsigned_int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::atomic<unsigned_int>_*,_std::default_delete<std::atomic<unsigned_int>_>_>
    .super__Head_base<0UL,_std::atomic<unsigned_int>_*,_false>._M_head_impl =
         (atomic<unsigned_int> *)0x0;
  }
  else {
    *(code **)_Var1._M_head_impl = operator();
    *(code **)(_Var1._M_head_impl + 2) = operator();
    *(undefined8 *)(_Var1._M_head_impl + 0x12) = in_RDX;
    *(load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> **)
     (_Var1._M_head_impl + 0x10) = load_blancer;
    *(undefined8 *)(_Var1._M_head_impl + 4) = 0;
    *(undefined8 *)(_Var1._M_head_impl + 6) = 0;
    *(undefined8 *)(_Var1._M_head_impl + 8) = 0;
    *(undefined1 *)&_Var1._M_head_impl[0xe].super___atomic_base<unsigned_int> = 0;
    (this->index)._M_t.
    super___uniq_ptr_impl<std::atomic<unsigned_int>,_std::default_delete<std::atomic<unsigned_int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::atomic<unsigned_int>_*,_std::default_delete<std::atomic<unsigned_int>_>_>
    .super__Head_base<0UL,_std::atomic<unsigned_int>_*,_false>._M_head_impl = _Var1._M_head_impl;
    *(undefined1 *)&_Var1._M_head_impl[0x14].super___atomic_base<unsigned_int> = 0;
  }
  return (LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
          )(LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
            )this;
}

Assistant:

async_simple::coro::Lazy<std::shared_ptr<client_pool_t>> operator()(
        const load_blancer& load_blancer) {
      auto i = index->fetch_add(1, std::memory_order_relaxed);
      co_return load_blancer
          .client_pools_[i % load_blancer.client_pools_.size()];
    }